

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void mzd_from_char_array(mzd_local_t *result,uint8_t *data,size_t len)

{
  word wVar1;
  size_t __n;
  ulong uVar2;
  uint64_t tmp;
  
  uVar2 = len + 7 >> 3;
  while (uVar2 != 0) {
    tmp = 0;
    __n = 8;
    if (len < 8) {
      __n = len;
    }
    memcpy(&tmp,data,__n);
    data = data + 8;
    len = len - 8;
    wVar1 = swap_bytes(tmp);
    result->w64[uVar2 - 1] = wVar1;
    uVar2 = uVar2 - 1;
  }
  return;
}

Assistant:

void mzd_from_char_array(mzd_local_t* result, const uint8_t* data, size_t len) {
  const size_t word_count = (len + 7) / sizeof(uint64_t);
  block_t* block          = BLOCK(result, 0);

  for (size_t i = word_count; i; --i, data += sizeof(uint64_t), len -= sizeof(uint64_t)) {
    uint64_t tmp = 0;
    memcpy(&tmp, data, MIN(sizeof(tmp), len));
    block->w64[i - 1] = be64toh(tmp);
  }
}